

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_common.cpp
# Opt level: O0

ssize_t __thiscall pstore::brokerface::writer::write(writer *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  ulong uVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  bool bVar3;
  bool local_31;
  uint local_20;
  bool infinite_tries;
  uint tries;
  bool error_on_timeout_local;
  message_type *msg_local;
  writer *this_local;
  
  local_20 = 0;
  bVar3 = this->max_retries_ == 0xffffffff;
  uVar2 = CONCAT71((int7)((ulong)this >> 8),bVar3);
  while( true ) {
    uVar2 = CONCAT71((int7)(uVar2 >> 8),1);
    local_31 = true;
    if (!bVar3) {
      local_31 = local_20 <= this->max_retries_;
      uVar2 = (ulong)CONCAT31((int3)(local_20 >> 8),local_31);
    }
    uVar2 = CONCAT71((int7)(uVar2 >> 8),local_31);
    if (local_31 == false) break;
    std::function<void_()>::operator()(&this->update_cb_);
    uVar1 = (*this->_vptr_writer[2])(this,CONCAT44(in_register_00000034,__fd));
    uVar2 = CONCAT44(extraout_var,uVar1);
    if ((uVar1 & 1) != 0) break;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&this->retry_timeout_);
    local_20 = local_20 + 1;
    uVar2 = (ulong)local_20;
  }
  if (((((ulong)__buf & 1) != 0) && (!bVar3)) &&
     (uVar2 = (ulong)local_20, this->max_retries_ < local_20)) {
    raise<pstore::error_code>(pipe_write_timeout);
  }
  return uVar2;
}

Assistant:

void writer::write (message_type const & msg, bool const error_on_timeout) {
            auto tries = 0U;
            bool const infinite_tries = max_retries_ == infinite_retries;
            for (; infinite_tries || tries <= max_retries_; ++tries) {
                update_cb_ ();
                if (this->write_impl (msg)) {
                    break;
                }
                std::this_thread::sleep_for (retry_timeout_);
            }

            if (error_on_timeout && !infinite_tries && tries > max_retries_) {
                raise (::pstore::error_code::pipe_write_timeout);
            }
        }